

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

session_params *
libtorrent::read_session_params
          (session_params *__return_storage_ptr__,bdecode_node *e,save_state_flags_t flags)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined8 uVar5;
  bool bVar6;
  type_t tVar7;
  long lVar8;
  int *piVar9;
  pointer pbVar10;
  dht_settings *pdVar11;
  byte bVar12;
  string_view key;
  string_view key_00;
  string_view key_01;
  undefined1 local_b8 [56];
  pointer local_80;
  pointer local_78;
  undefined1 local_68 [16];
  pointer local_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  pointer ppStack_48;
  int iStack_40;
  int local_3c;
  pointer ppStack_38;
  int iStack_30;
  
  bVar12 = 0;
  session_params::session_params(__return_storage_ptr__);
  ppStack_48 = (pointer)0x0;
  iStack_40 = 0;
  local_58 = (pointer)0x0;
  uStack_50 = 0;
  local_4c = 0;
  local_68 = (undefined1  [16])0x0;
  local_3c = -1;
  ppStack_38 = (pointer)0xffffffffffffffff;
  iStack_30 = -1;
  tVar7 = bdecode_node::type(e);
  if (tVar7 == dict_t) {
    if ((flags.m_val & 1) != 0) {
      key.len_ = 8;
      key.ptr_ = "settings";
      bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key);
      ppVar1 = local_58;
      uVar5 = local_68._0_8_;
      local_68._8_8_ = local_b8._8_8_;
      local_68._0_8_ = local_b8._0_8_;
      local_58 = (pointer)local_b8._16_8_;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      local_b8._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 == (pointer)0x0) {
        iStack_30 = (int)local_80;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
      }
      else {
        operator_delete((void *)uVar5,(long)ppVar1 - uVar5);
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        iStack_30 = (int)local_80;
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
      }
      bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar6) {
        load_pack_from_dict((settings_pack *)local_b8,(bdecode_node *)local_68);
        settings_pack::operator=(&__return_storage_ptr__->settings,(settings_pack *)local_b8);
        if ((pointer)local_b8._48_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._48_8_,(long)local_78 - local_b8._48_8_);
        }
        if ((pointer)local_b8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._24_8_,local_b8._40_8_ - local_b8._24_8_);
        }
        std::
        vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b8);
      }
    }
    if ((flags.m_val & 2) != 0) {
      key_00.len_ = 3;
      key_00.ptr_ = "dht";
      bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key_00);
      ppVar1 = local_58;
      uVar5 = local_68._0_8_;
      local_68._8_8_ = local_b8._8_8_;
      local_68._0_8_ = local_b8._0_8_;
      local_58 = (pointer)local_b8._16_8_;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      local_b8._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 == (pointer)0x0) {
        iStack_30 = (int)local_80;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
      }
      else {
        operator_delete((void *)uVar5,(long)ppVar1 - uVar5);
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        iStack_30 = (int)local_80;
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
      }
      bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar6) {
        dht::read_dht_settings((dht_settings *)local_b8,(bdecode_node *)local_68);
        piVar9 = (int *)local_b8;
        pdVar11 = &__return_storage_ptr__->dht_settings;
        for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
          pdVar11->max_peers_reply = *piVar9;
          piVar9 = piVar9 + (ulong)bVar12 * -2 + 1;
          pdVar11 = (dht_settings *)((long)pdVar11 + (ulong)bVar12 * -8 + 4);
        }
      }
    }
    if ((flags.m_val & 4) != 0) {
      key_01.len_ = 9;
      key_01.ptr_ = "dht state";
      bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key_01);
      ppVar1 = local_58;
      uVar5 = local_68._0_8_;
      local_68._8_8_ = local_b8._8_8_;
      local_68._0_8_ = local_b8._0_8_;
      local_58 = (pointer)local_b8._16_8_;
      local_b8._0_8_ = (pointer)0x0;
      local_b8._8_8_ = (pointer)0x0;
      local_b8._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 == (pointer)0x0) {
        iStack_30 = (int)local_80;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
      }
      else {
        operator_delete((void *)uVar5,(long)ppVar1 - uVar5);
        uStack_50 = (undefined4)local_b8._24_8_;
        local_4c = SUB84(local_b8._24_8_,4);
        ppStack_48 = (pointer)local_b8._32_8_;
        iStack_40 = (int)local_b8._40_8_;
        local_3c = SUB84(local_b8._40_8_,4);
        ppStack_38 = (pointer)local_b8._48_8_;
        iStack_30 = (int)local_80;
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
      }
      bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar6) {
        dht::read_dht_state((dht_state *)local_b8,(bdecode_node *)local_68);
        ppVar1 = (__return_storage_ptr__->dht_state).nids.
                 super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (__return_storage_ptr__->dht_state).nids.
                 super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->dht_state).nids.
        super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
        (__return_storage_ptr__->dht_state).nids.
        super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
        (__return_storage_ptr__->dht_state).nids.
        super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (pointer)0x0;
        local_b8._16_8_ = (pointer)0x0;
        if (ppVar1 != (pointer)0x0) {
          operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
        }
        pbVar3 = (__return_storage_ptr__->dht_state).nodes.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (__return_storage_ptr__->dht_state).nodes.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->dht_state).nodes.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._24_8_;
        (__return_storage_ptr__->dht_state).nodes.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._32_8_;
        (__return_storage_ptr__->dht_state).nodes.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._40_8_;
        local_b8._24_8_ = (pointer)0x0;
        local_b8._32_8_ = (pointer)0x0;
        local_b8._40_8_ = (pointer)0x0;
        if (pbVar3 != (pointer)0x0) {
          operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
        }
        pbVar3 = (__return_storage_ptr__->dht_state).nodes6.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (__return_storage_ptr__->dht_state).nodes6.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->dht_state).nodes6.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._48_8_;
        (__return_storage_ptr__->dht_state).nodes6.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_80;
        (__return_storage_ptr__->dht_state).nodes6.
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78;
        stack0xffffffffffffff78 = (undefined1  [16])0x0;
        local_78 = (pointer)0x0;
        if (pbVar3 != (pointer)0x0) {
          operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
          if ((pointer)local_b8._48_8_ != (pointer)0x0) {
            operator_delete((void *)local_b8._48_8_,(long)local_78 - local_b8._48_8_);
          }
        }
        if ((pointer)local_b8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._24_8_,local_b8._40_8_ - local_b8._24_8_);
        }
        if ((pointer)local_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
        }
      }
    }
    pbVar10 = (pointer)local_68._0_8_;
  }
  else {
    pbVar10 = (pointer)0x0;
  }
  if (pbVar10 != (pointer)0x0) {
    operator_delete(pbVar10,(long)local_58 - (long)pbVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params read_session_params(bdecode_node const& e, save_state_flags_t const flags)
	{
		session_params params;

		bdecode_node settings;
		if (e.type() != bdecode_node::dict_t) return params;

		if (flags & session_handle::save_settings)
		{
			settings = e.dict_find_dict("settings");
			if (settings)
			{
				params.settings = load_pack_from_dict(settings);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session_handle::save_dht_settings)
		{
			settings = e.dict_find_dict("dht");
			if (settings)
			{
				params.dht_settings = dht::read_dht_settings(settings);
			}
		}

		if (flags & session_handle::save_dht_state)
		{
			settings = e.dict_find_dict("dht state");
			if (settings)
			{
				params.dht_state = dht::read_dht_state(settings);
			}
		}
#endif

		return params;
	}